

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeOptions(ProjectWriter *this)

{
  undefined1 local_80 [32];
  undefined1 local_60 [48];
  undefined1 local_30 [40];
  ProjectWriter *this_local;
  
  local_30._32_8_ = this;
  std::operator<<((ostream *)&this->field_0x18,"\n[OPTIONS]\n");
  Options::hydOptionsToStr_abi_cxx11_((Options *)local_30);
  std::operator<<((ostream *)&this->field_0x18,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  std::operator<<((ostream *)&this->field_0x18,"\n");
  Options::demandOptionsToStr_abi_cxx11_((Options *)local_60);
  std::operator<<((ostream *)&this->field_0x18,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::operator<<((ostream *)&this->field_0x18,"\n");
  Options::qualOptionsToStr_abi_cxx11_((Options *)local_80);
  std::operator<<((ostream *)&this->field_0x18,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void ProjectWriter::writeOptions()
{
    fout << "\n[OPTIONS]\n";
    fout << network->options.hydOptionsToStr();
    fout << "\n";
    fout << network->options.demandOptionsToStr();
    fout << "\n";
    fout << network->options.qualOptionsToStr();
}